

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregateStates::Combine
          (WindowAggregateStates *this,WindowAggregateStates *target,
          AggregateCombineType combine_type)

{
  aggregate_combine_t p_Var1;
  type pVVar2;
  type pVVar3;
  AggregateInputData aggr_input_data;
  AggregateInputData local_48;
  
  local_48.bind_data.ptr = AggregateObject::GetFunctionData(&this->aggr);
  local_48.allocator = &this->allocator;
  local_48.combine_type = ALLOW_DESTRUCTIVE;
  p_Var1 = (this->aggr).function.combine;
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->statef);
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&target->statef);
  (*p_Var1)(pVVar2,pVVar3,&local_48,
            (ulong)((long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                          .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) / this->state_size);
  return;
}

Assistant:

void WindowAggregateStates::Combine(WindowAggregateStates &target, AggregateCombineType combine_type) {
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator, AggregateCombineType::ALLOW_DESTRUCTIVE);
	aggr.function.combine(*statef, *target.statef, aggr_input_data, GetCount());
}